

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O1

void __thiscall dbwrapper_tests::unicodepath::test_method(unicodepath *this)

{
  char cVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  path lockPath;
  CDBWrapper dbw;
  path ph;
  check_type cVar2;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  lazy_ostream local_198;
  undefined1 *local_188;
  char **local_180;
  assertion_result local_178;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  path local_140;
  DBParams local_118;
  CDBWrapper local_e0;
  path local_70;
  path local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_70,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_70,0x24,anon_var_dwarf_82ff5c);
  std::filesystem::__cxx11::path::path(&local_48,&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::path((path *)&local_118,&local_48);
  local_118.cache_bytes = 0x100000;
  local_118.memory_only = false;
  local_118.wipe_data = false;
  local_118.obfuscate = false;
  local_118.options.force_compact = false;
  CDBWrapper::CDBWrapper(&local_e0,&local_118);
  std::filesystem::__cxx11::path::~path((path *)&local_118);
  std::filesystem::__cxx11::path::path(&local_140,&local_48);
  std::filesystem::__cxx11::path::_M_append(&local_140,4,"LOCK");
  std::filesystem::__cxx11::path::path((path *)&local_118,&local_140);
  std::filesystem::__cxx11::path::~path(&local_140);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x18f;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  cVar1 = std::filesystem::status((path *)&local_118);
  local_178.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar1 != -1 && cVar1 != '\0');
  local_178.m_message.px = (element_type *)0x0;
  local_178.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = &local_1a8;
  local_1a8 = "fs::exists(lockPath)";
  local_1a0 = "";
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_1b0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_178,&local_198,1,0,WARN,_cVar2,(size_t)&local_1b8,399);
  boost::detail::shared_count::~shared_count(&local_178.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&local_118);
  CDBWrapper::~CDBWrapper(&local_e0);
  std::filesystem::__cxx11::path::~path(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unicodepath)
{
    // Attempt to create a database with a UTF8 character in the path.
    // On Windows this test will fail if the directory is created using
    // the ANSI CreateDirectoryA call and the code page isn't UTF8.
    // It will succeed if created with CreateDirectoryW.
    fs::path ph = m_args.GetDataDirBase() / "test_runner_₿_🏃_20191128_104644";
    CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20});

    fs::path lockPath = ph / "LOCK";
    BOOST_CHECK(fs::exists(lockPath));
}